

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

QuartetSet * __thiscall
OSTEI_VRR_Algorithm_Base::PruneQuartets_
          (QuartetSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QuartetSet *q,
          RRStepType rrstep)

{
  Quartet *this_00;
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
  *this_01;
  _Rb_tree_header *p_Var3;
  QuartetSet qnew;
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_90;
  QAM local_60;
  
  PruneQuartets_((OSTEI_VRR_Algorithm_Base *)__return_storage_ptr__,q);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (q->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(q->_M_t)._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      this_00 = (Quartet *)(p_Var2 + 1);
      bVar1 = Quartet::operator_cast_to_bool(this_00);
      if (bVar1) {
        Quartet::amlist(&local_60,this_00);
        bVar1 = 0 < local_60.qam._M_elems[(int)rrstep];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.tag._M_dataplus._M_p != &local_60.tag.field_2) {
          operator_delete(local_60.tag._M_dataplus._M_p);
        }
      }
      else {
        bVar1 = false;
      }
      this_01 = (_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                 *)__return_storage_ptr__;
      if (bVar1) {
        this_01 = (_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                   *)&local_90;
      }
      std::
      _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>::
      _M_insert_unique<Quartet_const&>(this_01,this_00);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::operator=(&q->_M_t,&local_90);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_90);
  return __return_storage_ptr__;
}

Assistant:

QuartetSet OSTEI_VRR_Algorithm_Base::PruneQuartets_(QuartetSet & q, RRStepType rrstep) const
{
    // this function is a mess

    // remove ssss
    PruneQuartets_(q);
 
    // now remove any where the rrstep index is 0
    QuartetSet qnew;
    QuartetSet qret;

    int stepidx = static_cast<int>(rrstep);

    for(const auto & it : q)
    {
        if(it && it.amlist()[stepidx] > 0)
            qnew.insert(it);
        else
            qret.insert(it);
    }

    q = qnew;
    return qret;
}